

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

char * nifti_image_to_ascii(nifti_image *nim)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  undefined8 in_R9;
  uint uVar11;
  int k;
  int j;
  int i;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  uint local_84;
  uint local_80;
  uint local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (nim != (nifti_image *)0x0) {
    pcVar5 = (char *)calloc(1,0xfffe);
    if (pcVar5 != (char *)0x0) {
      builtin_strncpy(pcVar5,"<nifti_image\n",0xe);
      sVar6 = strlen(pcVar5);
      iVar2 = nim->nifti_type;
      if (iVar2 == 1) {
        pcVar8 = "NIFTI-1+";
      }
      else if (iVar2 == 2) {
        pcVar8 = "NIFTI-1";
      }
      else {
        pcVar8 = "ANALYZE-7.5";
        if (iVar2 == 3) {
          pcVar8 = "NIFTI-1A";
        }
      }
      sprintf(pcVar5 + sVar6,"  nifti_type = \'%s\'\n",pcVar8);
      pcVar8 = escapize_string(nim->fname);
      sVar6 = strlen(pcVar5);
      sprintf(pcVar5 + sVar6,"  header_filename = %s\n",pcVar8);
      free(pcVar8);
      pcVar8 = escapize_string(nim->iname);
      sVar6 = strlen(pcVar5);
      sprintf(pcVar5 + sVar6,"  image_filename = %s\n",pcVar8);
      free(pcVar8);
      sVar6 = strlen(pcVar5);
      sprintf(pcVar5 + sVar6,"  image_offset = \'%d\'\n",(ulong)(uint)nim->iname_offset);
      sVar6 = strlen(pcVar5);
      sprintf(pcVar5 + sVar6,"  ndim = \'%d\'\n",(ulong)(uint)nim->ndim);
      sVar6 = strlen(pcVar5);
      sprintf(pcVar5 + sVar6,"  nx = \'%d\'\n",(ulong)(uint)nim->nx);
      if (1 < nim->ndim) {
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  ny = \'%d\'\n",(ulong)(uint)nim->ny);
      }
      if (2 < nim->ndim) {
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  nz = \'%d\'\n",(ulong)(uint)nim->nz);
      }
      if (3 < nim->ndim) {
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  nt = \'%d\'\n",(ulong)(uint)nim->nt);
      }
      if (4 < nim->ndim) {
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  nu = \'%d\'\n",(ulong)(uint)nim->nu);
      }
      if (5 < nim->ndim) {
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  nv = \'%d\'\n",(ulong)(uint)nim->nv);
      }
      if (6 < nim->ndim) {
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  nw = \'%d\'\n",(ulong)(uint)nim->nw);
      }
      sVar6 = strlen(pcVar5);
      sprintf(pcVar5 + sVar6,"  dx = \'%g\'\n",SUB84((double)nim->dx,0));
      if (1 < nim->ndim) {
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  dy = \'%g\'\n",SUB84((double)nim->dy,0));
      }
      if (2 < nim->ndim) {
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  dz = \'%g\'\n",SUB84((double)nim->dz,0));
      }
      if (3 < nim->ndim) {
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  dt = \'%g\'\n",SUB84((double)nim->dt,0));
      }
      if (4 < nim->ndim) {
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  du = \'%g\'\n",SUB84((double)nim->du,0));
      }
      if (5 < nim->ndim) {
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  dv = \'%g\'\n",SUB84((double)nim->dv,0));
      }
      if (6 < nim->ndim) {
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  dw = \'%g\'\n",SUB84((double)nim->dw,0));
      }
      sVar6 = strlen(pcVar5);
      sprintf(pcVar5 + sVar6,"  datatype = \'%d\'\n",(ulong)(uint)nim->datatype);
      sVar6 = strlen(pcVar5);
      pcVar8 = nifti_datatype_string(nim->datatype);
      sprintf(pcVar5 + sVar6,"  datatype_name = \'%s\'\n",pcVar8);
      sVar6 = strlen(pcVar5);
      sprintf(pcVar5 + sVar6,"  nvox = \'%u\'\n",(ulong)(uint)nim->nvox);
      sVar6 = strlen(pcVar5);
      sprintf(pcVar5 + sVar6,"  nbyper = \'%d\'\n",(ulong)(uint)nim->nbyper);
      sVar6 = strlen(pcVar5);
      pcVar8 = "LSB_FIRST";
      if (nim->byteorder == 2) {
        pcVar8 = "MSB_FIRST";
      }
      sprintf(pcVar5 + sVar6,"  byteorder = \'%s\'\n",pcVar8);
      fVar1 = nim->cal_min;
      if (fVar1 < nim->cal_max) {
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  cal_min = \'%g\'\n",SUB84((double)fVar1,0));
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  cal_max = \'%g\'\n",SUB84((double)nim->cal_max,0));
      }
      fVar1 = nim->scl_slope;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  scl_slope = \'%g\'\n",SUB84((double)fVar1,0));
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  scl_inter = \'%g\'\n",SUB84((double)nim->scl_inter,0));
      }
      uVar11 = nim->intent_code;
      if (0 < (int)uVar11) {
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  intent_code = \'%d\'\n",(ulong)uVar11);
        sVar6 = strlen(pcVar5);
        pcVar8 = nifti_intent_string(nim->intent_code);
        sprintf(pcVar5 + sVar6,"  intent_code_name = \'%s\'\n",pcVar8);
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  intent_p1 = \'%g\'\n",SUB84((double)nim->intent_p1,0));
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  intent_p2 = \'%g\'\n",SUB84((double)nim->intent_p2,0));
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  intent_p3 = \'%g\'\n",SUB84((double)nim->intent_p3,0));
        if (nim->intent_name[0] != '\0') {
          pcVar8 = escapize_string(nim->intent_name);
          sVar6 = strlen(pcVar5);
          sprintf(pcVar5 + sVar6,"  intent_name = %s\n",pcVar8);
          free(pcVar8);
        }
      }
      fVar1 = nim->toffset;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  toffset = \'%g\'\n",SUB84((double)fVar1,0));
      }
      uVar11 = nim->xyz_units;
      if (0 < (int)uVar11) {
        sVar6 = strlen(pcVar5);
        pcVar8 = nifti_units_string(uVar11);
        sprintf(pcVar5 + sVar6,"  xyz_units = \'%d\'\n  xyz_units_name = \'%s\'\n",(ulong)uVar11,
                pcVar8);
      }
      uVar11 = nim->time_units;
      if (0 < (int)uVar11) {
        sVar6 = strlen(pcVar5);
        pcVar8 = nifti_units_string(uVar11);
        sprintf(pcVar5 + sVar6,"  time_units = \'%d\'\n  time_units_name = \'%s\'\n",(ulong)uVar11,
                pcVar8);
      }
      uVar11 = nim->freq_dim;
      if (0 < (int)uVar11) {
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  freq_dim = \'%d\'\n",(ulong)uVar11);
      }
      uVar11 = nim->phase_dim;
      if (0 < (int)uVar11) {
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  phase_dim = \'%d\'\n",(ulong)uVar11);
      }
      uVar11 = nim->slice_dim;
      if (0 < (int)uVar11) {
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  slice_dim = \'%d\'\n",(ulong)uVar11);
      }
      uVar11 = nim->slice_code;
      if (0 < (long)(int)uVar11) {
        sVar6 = strlen(pcVar5);
        if (uVar11 < 7) {
          pcVar8 = (&nifti_type_list[0x2a].name)[(int)uVar11];
        }
        else {
          pcVar8 = "Unknown";
        }
        sprintf(pcVar5 + sVar6,"  slice_code = \'%d\'\n  slice_code_name = \'%s\'\n",(ulong)uVar11,
                pcVar8);
      }
      uVar11 = nim->slice_start;
      if ((-1 < (int)uVar11) && (uVar3 = nim->slice_end, (int)uVar11 < (int)uVar3)) {
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  slice_start = \'%d\'\n  slice_end = \'%d\'\n",(ulong)uVar11,
                (ulong)uVar3);
      }
      fVar1 = nim->slice_duration;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  slice_duration = \'%g\'\n",SUB84((double)fVar1,0));
      }
      if (nim->descrip[0] != '\0') {
        pcVar8 = escapize_string(nim->descrip);
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  descrip = %s\n",pcVar8);
        free(pcVar8);
      }
      if (nim->aux_file[0] != '\0') {
        pcVar8 = escapize_string(nim->aux_file);
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,"  aux_file = %s\n",pcVar8);
        free(pcVar8);
      }
      uVar11 = nim->qform_code;
      if (0 < (long)(int)uVar11) {
        sVar6 = strlen(pcVar5);
        if (uVar11 < 5) {
          pcVar8 = (&PTR_anon_var_dwarf_876f_00136d70)[(int)uVar11];
        }
        else {
          pcVar8 = "Unknown";
        }
        sprintf(pcVar5 + sVar6,
                "  qform_code = \'%d\'\n  qform_code_name = \'%s\'\n  qto_xyz_matrix = \'%g %g %g %g %g %g %g %g %g %g %g %g %g %g %g %g\'\n"
                ,SUB84((double)(nim->qto_xyz).m[0][0],0),SUB84((double)(nim->qto_xyz).m[0][1],0),
                SUB84((double)(nim->qto_xyz).m[0][2],0),SUB84((double)(nim->qto_xyz).m[0][3],0),
                (double)(nim->qto_xyz).m[1][0],(double)(nim->qto_xyz).m[1][1],
                (double)(nim->qto_xyz).m[1][2],(double)(nim->qto_xyz).m[1][3],(ulong)uVar11,pcVar8);
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,
                "  qto_ijk_matrix = \'%g %g %g %g %g %g %g %g %g %g %g %g %g %g %g %g\'\n",
                SUB84((double)(nim->qto_ijk).m[0][0],0),SUB84((double)(nim->qto_ijk).m[0][1],0),
                SUB84((double)(nim->qto_ijk).m[0][2],0),SUB84((double)(nim->qto_ijk).m[0][3],0),
                (double)(nim->qto_ijk).m[1][0],(double)(nim->qto_ijk).m[1][1],
                (double)(nim->qto_ijk).m[1][2],(double)(nim->qto_ijk).m[1][3]);
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,
                "  quatern_b = \'%g\'\n  quatern_c = \'%g\'\n  quatern_d = \'%g\'\n  qoffset_x = \'%g\'\n  qoffset_y = \'%g\'\n  qoffset_z = \'%g\'\n  qfac = \'%g\'\n"
                ,SUB84((double)nim->quatern_b,0),SUB84((double)nim->quatern_c,0),
                SUB84((double)nim->quatern_d,0),SUB84((double)nim->qoffset_x,0),
                (double)nim->qoffset_y,(double)nim->qoffset_z,(double)nim->qfac);
        uVar12 = *(undefined8 *)(nim->qto_xyz).m[0];
        uVar13 = *(undefined8 *)((nim->qto_xyz).m[0] + 2);
        uVar14 = *(undefined8 *)(nim->qto_xyz).m[1];
        uVar15 = *(undefined8 *)((nim->qto_xyz).m[1] + 2);
        uVar16 = *(undefined8 *)(nim->qto_xyz).m[2];
        uVar17 = *(undefined8 *)((nim->qto_xyz).m[2] + 2);
        uVar18 = *(undefined8 *)(nim->qto_xyz).m[3];
        uVar19 = *(undefined8 *)((nim->qto_xyz).m[3] + 2);
        local_78 = uVar12;
        uStack_70 = uVar13;
        local_68 = uVar14;
        uStack_60 = uVar15;
        local_58 = uVar16;
        uStack_50 = uVar17;
        local_48 = uVar18;
        uStack_40 = uVar19;
        nifti_mat44_to_orientation((int *)&local_7c,(int *)&local_80,(int *)&local_84);
        uVar4 = local_7c;
        uVar3 = local_80;
        uVar11 = local_84;
        lVar9 = (long)(int)local_7c;
        if (0 < (int)local_84 && (0 < (int)local_80 && 0 < lVar9)) {
          sVar6 = strlen(pcVar5);
          pcVar10 = "Unknown";
          pcVar8 = "Unknown";
          if (uVar4 < 7) {
            pcVar8 = (&PTR_anon_var_dwarf_853f_00136d90)[lVar9];
          }
          pcVar7 = "Unknown";
          if (uVar3 < 7) {
            pcVar7 = (&PTR_anon_var_dwarf_853f_00136d90)[(int)uVar3];
          }
          if (uVar11 < 7) {
            pcVar10 = (&PTR_anon_var_dwarf_853f_00136d90)[(int)uVar11];
          }
          sprintf(pcVar5 + sVar6,
                  "  qform_i_orientation = \'%s\'\n  qform_j_orientation = \'%s\'\n  qform_k_orientation = \'%s\'\n"
                  ,pcVar8,pcVar7,pcVar10,in_R9,uVar12,uVar13,uVar14,uVar15,uVar16,uVar17,uVar18,
                  uVar19);
        }
      }
      uVar11 = nim->sform_code;
      if (0 < (long)(int)uVar11) {
        sVar6 = strlen(pcVar5);
        if (uVar11 < 5) {
          pcVar8 = (&PTR_anon_var_dwarf_876f_00136d70)[(int)uVar11];
        }
        else {
          pcVar8 = "Unknown";
        }
        sprintf(pcVar5 + sVar6,
                "  sform_code = \'%d\'\n  sform_code_name = \'%s\'\n  sto_xyz_matrix = \'%g %g %g %g %g %g %g %g %g %g %g %g %g %g %g %g\'\n"
                ,SUB84((double)(nim->sto_xyz).m[0][0],0),SUB84((double)(nim->sto_xyz).m[0][1],0),
                SUB84((double)(nim->sto_xyz).m[0][2],0),SUB84((double)(nim->sto_xyz).m[0][3],0),
                (double)(nim->sto_xyz).m[1][0],(double)(nim->sto_xyz).m[1][1],
                (double)(nim->sto_xyz).m[1][2],(double)(nim->sto_xyz).m[1][3],(ulong)uVar11,pcVar8);
        sVar6 = strlen(pcVar5);
        sprintf(pcVar5 + sVar6,
                "  sto_ijk matrix = \'%g %g %g %g %g %g %g %g %g %g %g %g %g %g %g %g\'\n",
                SUB84((double)(nim->sto_ijk).m[0][0],0),SUB84((double)(nim->sto_ijk).m[0][1],0),
                SUB84((double)(nim->sto_ijk).m[0][2],0),SUB84((double)(nim->sto_ijk).m[0][3],0),
                (double)(nim->sto_ijk).m[1][0],(double)(nim->sto_ijk).m[1][1],
                (double)(nim->sto_ijk).m[1][2],(double)(nim->sto_ijk).m[1][3]);
        uVar12 = *(undefined8 *)(nim->sto_xyz).m[0];
        uVar13 = *(undefined8 *)((nim->sto_xyz).m[0] + 2);
        uVar14 = *(undefined8 *)(nim->sto_xyz).m[1];
        uVar15 = *(undefined8 *)((nim->sto_xyz).m[1] + 2);
        uVar16 = *(undefined8 *)(nim->sto_xyz).m[2];
        uVar17 = *(undefined8 *)((nim->sto_xyz).m[2] + 2);
        uVar18 = *(undefined8 *)(nim->sto_xyz).m[3];
        uVar19 = *(undefined8 *)((nim->sto_xyz).m[3] + 2);
        local_78 = uVar12;
        uStack_70 = uVar13;
        local_68 = uVar14;
        uStack_60 = uVar15;
        local_58 = uVar16;
        uStack_50 = uVar17;
        local_48 = uVar18;
        uStack_40 = uVar19;
        nifti_mat44_to_orientation((int *)&local_7c,(int *)&local_80,(int *)&local_84);
        if (0 < (int)local_84 && (0 < (int)local_80 && 0 < (long)(int)local_7c)) {
          sVar6 = strlen(pcVar5);
          pcVar10 = "Unknown";
          pcVar8 = "Unknown";
          if (local_7c < 7) {
            pcVar8 = (&PTR_anon_var_dwarf_853f_00136d90)[(int)local_7c];
          }
          pcVar7 = "Unknown";
          if (local_80 < 7) {
            pcVar7 = (&PTR_anon_var_dwarf_853f_00136d90)[(int)local_80];
          }
          if (local_84 < 7) {
            pcVar10 = (&PTR_anon_var_dwarf_853f_00136d90)[(int)local_84];
          }
          sprintf(pcVar5 + sVar6,
                  "  sform_i_orientation = \'%s\'\n  sform_j_orientation = \'%s\'\n  sform_k_orientation = \'%s\'\n"
                  ,pcVar8,pcVar7,pcVar10,in_R9,uVar12,uVar13,uVar14,uVar15,uVar16,uVar17,uVar18,
                  uVar19);
        }
      }
      sVar6 = strlen(pcVar5);
      sprintf(pcVar5 + sVar6,"  num_ext = \'%d\'\n",(ulong)(uint)nim->num_ext);
      sVar6 = strlen(pcVar5);
      builtin_strncpy(pcVar5 + sVar6,"/>\n",4);
      sVar6 = strlen(pcVar5);
      uVar11 = (int)sVar6 + 1;
      pcVar5 = (char *)realloc(pcVar5,(long)(int)uVar11);
      if (pcVar5 != (char *)0x0) {
        return pcVar5;
      }
      fprintf(_stderr,"** NITA: failed to realloc %d bytes\n",(ulong)uVar11);
      return (char *)0x0;
    }
    nifti_image_to_ascii_cold_1();
  }
  return (char *)0x0;
}

Assistant:

char *nifti_image_to_ascii( const nifti_image *nim )
{
   char *buf , *ebuf ; int nbuf ;

   if( nim == NULL ) return NULL ;   /* stupid caller */

   buf = (char *)calloc(1,65534); nbuf = 0; /* longer than needed, to be safe */
   if( !buf ){
      fprintf(stderr,"** NITA: failed to alloc %d bytes\n",65534);
      return NULL;
   }

   sprintf( buf , "<nifti_image\n" ) ;   /* XML-ish opener */

   sprintf( buf+strlen(buf) , "  nifti_type = '%s'\n" ,
              (nim->nifti_type == NIFTI_FTYPE_NIFTI1_1) ? "NIFTI-1+"
             :(nim->nifti_type == NIFTI_FTYPE_NIFTI1_2) ? "NIFTI-1"
             :(nim->nifti_type == NIFTI_FTYPE_ASCII   ) ? "NIFTI-1A"
             :                         "ANALYZE-7.5" ) ;

   /** Strings that we don't control (filenames, etc.) that might
       contain "weird" characters (like quotes) are "escaped":
       - A few special characters are replaced by XML-style escapes, using
         the function escapize_string().
       - On input, function unescape_string() reverses this process.
       - The result is that the NIFTI ASCII-format header is XML-compliant. */

   ebuf = escapize_string(nim->fname) ;
   sprintf( buf+strlen(buf) , "  header_filename = %s\n",ebuf); free(ebuf);

   ebuf = escapize_string(nim->iname) ;
   sprintf( buf+strlen(buf) , "  image_filename = %s\n", ebuf); free(ebuf);

   sprintf( buf+strlen(buf) , "  image_offset = '%d'\n" , nim->iname_offset );

                       sprintf( buf+strlen(buf), "  ndim = '%d'\n", nim->ndim);
                       sprintf( buf+strlen(buf), "  nx = '%d'\n",   nim->nx  );
   if( nim->ndim > 1 ) sprintf( buf+strlen(buf), "  ny = '%d'\n",   nim->ny  );
   if( nim->ndim > 2 ) sprintf( buf+strlen(buf), "  nz = '%d'\n",   nim->nz  );
   if( nim->ndim > 3 ) sprintf( buf+strlen(buf), "  nt = '%d'\n",   nim->nt  );
   if( nim->ndim > 4 ) sprintf( buf+strlen(buf), "  nu = '%d'\n",   nim->nu  );
   if( nim->ndim > 5 ) sprintf( buf+strlen(buf), "  nv = '%d'\n",   nim->nv  );
   if( nim->ndim > 6 ) sprintf( buf+strlen(buf), "  nw = '%d'\n",   nim->nw  );
                       sprintf( buf+strlen(buf), "  dx = '%g'\n",   nim->dx  );
   if( nim->ndim > 1 ) sprintf( buf+strlen(buf), "  dy = '%g'\n",   nim->dy  );
   if( nim->ndim > 2 ) sprintf( buf+strlen(buf), "  dz = '%g'\n",   nim->dz  );
   if( nim->ndim > 3 ) sprintf( buf+strlen(buf), "  dt = '%g'\n",   nim->dt  );
   if( nim->ndim > 4 ) sprintf( buf+strlen(buf), "  du = '%g'\n",   nim->du  );
   if( nim->ndim > 5 ) sprintf( buf+strlen(buf), "  dv = '%g'\n",   nim->dv  );
   if( nim->ndim > 6 ) sprintf( buf+strlen(buf), "  dw = '%g'\n",   nim->dw  );

   sprintf( buf+strlen(buf) , "  datatype = '%d'\n" , nim->datatype ) ;
   sprintf( buf+strlen(buf) , "  datatype_name = '%s'\n" ,
                              nifti_datatype_string(nim->datatype) ) ;

   sprintf( buf+strlen(buf) , "  nvox = '%u'\n" , (unsigned)nim->nvox ) ;
   sprintf( buf+strlen(buf) , "  nbyper = '%d'\n" , nim->nbyper ) ;

   sprintf( buf+strlen(buf) , "  byteorder = '%s'\n" ,
            (nim->byteorder==MSB_FIRST) ? "MSB_FIRST" : "LSB_FIRST" ) ;

   if( nim->cal_min < nim->cal_max ){
     sprintf( buf+strlen(buf) , "  cal_min = '%g'\n", nim->cal_min ) ;
     sprintf( buf+strlen(buf) , "  cal_max = '%g'\n", nim->cal_max ) ;
   }

   if( nim->scl_slope != 0.0 ){
     sprintf( buf+strlen(buf) , "  scl_slope = '%g'\n" , nim->scl_slope ) ;
     sprintf( buf+strlen(buf) , "  scl_inter = '%g'\n" , nim->scl_inter ) ;
   }

   if( nim->intent_code > 0 ){
     sprintf( buf+strlen(buf) , "  intent_code = '%d'\n", nim->intent_code ) ;
     sprintf( buf+strlen(buf) , "  intent_code_name = '%s'\n" ,
                                nifti_intent_string(nim->intent_code) ) ;
     sprintf( buf+strlen(buf) , "  intent_p1 = '%g'\n" , nim->intent_p1 ) ;
     sprintf( buf+strlen(buf) , "  intent_p2 = '%g'\n" , nim->intent_p2 ) ;
     sprintf( buf+strlen(buf) , "  intent_p3 = '%g'\n" , nim->intent_p3 ) ;

     if( nim->intent_name[0] != '\0' ){
       ebuf = escapize_string(nim->intent_name) ;
       sprintf( buf+strlen(buf) , "  intent_name = %s\n",ebuf) ;
       free(ebuf) ;
     }
   }

   if( nim->toffset != 0.0 )
     sprintf( buf+strlen(buf) , "  toffset = '%g'\n",nim->toffset ) ;

   if( nim->xyz_units > 0 )
     sprintf( buf+strlen(buf) ,
              "  xyz_units = '%d'\n"
              "  xyz_units_name = '%s'\n" ,
              nim->xyz_units , nifti_units_string(nim->xyz_units) ) ;

   if( nim->time_units > 0 )
     sprintf( buf+strlen(buf) ,
              "  time_units = '%d'\n"
              "  time_units_name = '%s'\n" ,
              nim->time_units , nifti_units_string(nim->time_units) ) ;

   if( nim->freq_dim > 0 )
     sprintf( buf+strlen(buf) , "  freq_dim = '%d'\n",nim->freq_dim ) ;
   if( nim->phase_dim > 0 )
     sprintf( buf+strlen(buf) , "  phase_dim = '%d'\n",nim->phase_dim ) ;
   if( nim->slice_dim > 0 )
     sprintf( buf+strlen(buf) , "  slice_dim = '%d'\n",nim->slice_dim ) ;
   if( nim->slice_code > 0 )
     sprintf( buf+strlen(buf) ,
              "  slice_code = '%d'\n"
              "  slice_code_name = '%s'\n" ,
              nim->slice_code , nifti_slice_string(nim->slice_code) ) ;
   if( nim->slice_start >= 0 && nim->slice_end > nim->slice_start )
     sprintf( buf+strlen(buf) ,
              "  slice_start = '%d'\n"
              "  slice_end = '%d'\n"  , nim->slice_start , nim->slice_end ) ;
   if( nim->slice_duration != 0.0 )
     sprintf( buf+strlen(buf) , "  slice_duration = '%g'\n",
              nim->slice_duration ) ;

   if( nim->descrip[0] != '\0' ){
     ebuf = escapize_string(nim->descrip) ;
     sprintf( buf+strlen(buf) , "  descrip = %s\n",ebuf) ;
     free(ebuf) ;
   }

   if( nim->aux_file[0] != '\0' ){
     ebuf = escapize_string(nim->aux_file) ;
     sprintf( buf+strlen(buf) , "  aux_file = %s\n",ebuf) ;
     free(ebuf) ;
   }

   if( nim->qform_code > 0 ){
     int i,j,k ;

     sprintf( buf+strlen(buf) ,
              "  qform_code = '%d'\n"
              "  qform_code_name = '%s'\n"
     "  qto_xyz_matrix = '%g %g %g %g %g %g %g %g %g %g %g %g %g %g %g %g'\n" ,
         nim->qform_code      , nifti_xform_string(nim->qform_code) ,
         nim->qto_xyz.m[0][0] , nim->qto_xyz.m[0][1] ,
         nim->qto_xyz.m[0][2] , nim->qto_xyz.m[0][3] ,
         nim->qto_xyz.m[1][0] , nim->qto_xyz.m[1][1] ,
         nim->qto_xyz.m[1][2] , nim->qto_xyz.m[1][3] ,
         nim->qto_xyz.m[2][0] , nim->qto_xyz.m[2][1] ,
         nim->qto_xyz.m[2][2] , nim->qto_xyz.m[2][3] ,
         nim->qto_xyz.m[3][0] , nim->qto_xyz.m[3][1] ,
         nim->qto_xyz.m[3][2] , nim->qto_xyz.m[3][3]  ) ;

     sprintf( buf+strlen(buf) ,
     "  qto_ijk_matrix = '%g %g %g %g %g %g %g %g %g %g %g %g %g %g %g %g'\n" ,
         nim->qto_ijk.m[0][0] , nim->qto_ijk.m[0][1] ,
         nim->qto_ijk.m[0][2] , nim->qto_ijk.m[0][3] ,
         nim->qto_ijk.m[1][0] , nim->qto_ijk.m[1][1] ,
         nim->qto_ijk.m[1][2] , nim->qto_ijk.m[1][3] ,
         nim->qto_ijk.m[2][0] , nim->qto_ijk.m[2][1] ,
         nim->qto_ijk.m[2][2] , nim->qto_ijk.m[2][3] ,
         nim->qto_ijk.m[3][0] , nim->qto_ijk.m[3][1] ,
         nim->qto_ijk.m[3][2] , nim->qto_ijk.m[3][3]  ) ;

     sprintf( buf+strlen(buf) ,
              "  quatern_b = '%g'\n"
              "  quatern_c = '%g'\n"
              "  quatern_d = '%g'\n"
              "  qoffset_x = '%g'\n"
              "  qoffset_y = '%g'\n"
              "  qoffset_z = '%g'\n"
              "  qfac = '%g'\n" ,
         nim->quatern_b , nim->quatern_c , nim->quatern_d ,
         nim->qoffset_x , nim->qoffset_y , nim->qoffset_z , nim->qfac ) ;

     nifti_mat44_to_orientation( nim->qto_xyz , &i,&j,&k ) ;
     if( i > 0 && j > 0 && k > 0 )
       sprintf( buf+strlen(buf) ,
                "  qform_i_orientation = '%s'\n"
                "  qform_j_orientation = '%s'\n"
                "  qform_k_orientation = '%s'\n" ,
                nifti_orientation_string(i) ,
                nifti_orientation_string(j) ,
                nifti_orientation_string(k)  ) ;
   }

   if( nim->sform_code > 0 ){
     int i,j,k ;

     sprintf( buf+strlen(buf) ,
              "  sform_code = '%d'\n"
              "  sform_code_name = '%s'\n"
     "  sto_xyz_matrix = '%g %g %g %g %g %g %g %g %g %g %g %g %g %g %g %g'\n" ,
         nim->sform_code      , nifti_xform_string(nim->sform_code) ,
         nim->sto_xyz.m[0][0] , nim->sto_xyz.m[0][1] ,
         nim->sto_xyz.m[0][2] , nim->sto_xyz.m[0][3] ,
         nim->sto_xyz.m[1][0] , nim->sto_xyz.m[1][1] ,
         nim->sto_xyz.m[1][2] , nim->sto_xyz.m[1][3] ,
         nim->sto_xyz.m[2][0] , nim->sto_xyz.m[2][1] ,
         nim->sto_xyz.m[2][2] , nim->sto_xyz.m[2][3] ,
         nim->sto_xyz.m[3][0] , nim->sto_xyz.m[3][1] ,
         nim->sto_xyz.m[3][2] , nim->sto_xyz.m[3][3]  ) ;

     sprintf( buf+strlen(buf) ,
     "  sto_ijk matrix = '%g %g %g %g %g %g %g %g %g %g %g %g %g %g %g %g'\n" ,
         nim->sto_ijk.m[0][0] , nim->sto_ijk.m[0][1] ,
         nim->sto_ijk.m[0][2] , nim->sto_ijk.m[0][3] ,
         nim->sto_ijk.m[1][0] , nim->sto_ijk.m[1][1] ,
         nim->sto_ijk.m[1][2] , nim->sto_ijk.m[1][3] ,
         nim->sto_ijk.m[2][0] , nim->sto_ijk.m[2][1] ,
         nim->sto_ijk.m[2][2] , nim->sto_ijk.m[2][3] ,
         nim->sto_ijk.m[3][0] , nim->sto_ijk.m[3][1] ,
         nim->sto_ijk.m[3][2] , nim->sto_ijk.m[3][3]  ) ;

     nifti_mat44_to_orientation( nim->sto_xyz , &i,&j,&k ) ;
     if( i > 0 && j > 0 && k > 0 )
       sprintf( buf+strlen(buf) ,
                "  sform_i_orientation = '%s'\n"
                "  sform_j_orientation = '%s'\n"
                "  sform_k_orientation = '%s'\n" ,
                nifti_orientation_string(i) ,
                nifti_orientation_string(j) ,
                nifti_orientation_string(k)  ) ;
   }

   sprintf( buf+strlen(buf) , "  num_ext = '%d'\n", nim->num_ext ) ;

   sprintf( buf+strlen(buf) , "/>\n" ) ;   /* XML-ish closer */

   nbuf = (int)strlen(buf) ;
   buf  = (char *)realloc((void *)buf, nbuf+1); /* cut back to proper length */
   if( !buf ) fprintf(stderr,"** NITA: failed to realloc %d bytes\n",nbuf+1);
   return buf ;
}